

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void amrex::MLABecLaplacian::FFlux
               (Box *box,Real *dxinv,Real bscalar,Array<const_FArrayBox_*,_3> *bcoef,
               Array<FArrayBox_*,_3> *flux,FArrayBox *sol,int face_only,int ncomp)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  FArrayBox *pFVar11;
  FArrayBox *pFVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  int iVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  long lVar74;
  int iVar75;
  long lVar76;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  double *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1d0;
  long local_1b8;
  double *local_1b0;
  long local_198;
  long local_140;
  long local_118;
  long local_110;
  long local_108;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  
  pFVar11 = bcoef->_M_elems[0];
  pFVar12 = bcoef->_M_elems[1];
  pdVar59 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar70 = (long)iVar2;
  iVar72 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  iVar22 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar74 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar48 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar72) + 1);
  lVar30 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar22) + 1);
  pdVar13 = (pFVar12->super_BaseFab<double>).dptr;
  iVar2 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[0];
  lVar60 = (long)iVar2;
  iVar53 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[1];
  lVar65 = (long)iVar53;
  iVar54 = (pFVar12->super_BaseFab<double>).domain.smallend.vect[2];
  lVar31 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar32 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[1] - iVar53) + 1);
  lVar23 = (long)(((pFVar12->super_BaseFab<double>).domain.bigend.vect[2] - iVar54) + 1);
  pFVar11 = bcoef->_M_elems[2];
  pdVar14 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar49 = (long)iVar2;
  iVar53 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar61 = (long)iVar53;
  iVar3 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar33 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar34 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar53) + 1);
  lVar24 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  pFVar11 = flux->_M_elems[0];
  pdVar15 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar46 = (long)iVar2;
  iVar53 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  iVar67 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar35 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar36 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar53) + 1);
  lVar25 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar67) + 1);
  pFVar11 = flux->_M_elems[1];
  pdVar16 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar50 = (long)iVar2;
  iVar20 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar62 = (long)iVar20;
  iVar4 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar37 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar38 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar20) + 1);
  lVar26 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  pFVar11 = flux->_M_elems[2];
  pdVar17 = (pFVar11->super_BaseFab<double>).dptr;
  iVar2 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar51 = (long)iVar2;
  iVar20 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar63 = (long)iVar20;
  iVar5 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar39 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
  lVar40 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar20) + 1);
  lVar27 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  pdVar18 = (sol->super_BaseFab<double>).dptr;
  uVar6 = (sol->super_BaseFab<double>).domain.smallend.vect[0];
  lVar64 = (long)(int)uVar6;
  uVar7 = (sol->super_BaseFab<double>).domain.smallend.vect[1];
  lVar66 = (long)(int)uVar7;
  uVar8 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
  lVar68 = (long)(int)uVar8;
  lVar28 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[0] - uVar6) + 1);
  lVar41 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[1] - uVar7) + 1);
  lVar42 = lVar41 * lVar28;
  lVar29 = (int)(((sol->super_BaseFab<double>).domain.bigend.vect[2] - uVar8) + 1) * lVar42;
  if (face_only == 0) {
    uVar9 = (box->btype).itype;
    if (0 < ncomp) {
      iVar47 = (~uVar9 & 1) + (box->bigend).vect[0];
      iVar2 = (box->bigend).vect[1];
      iVar20 = (box->bigend).vect[2];
      iVar75 = (box->smallend).vect[2];
      lVar71 = (long)iVar75;
      iVar21 = (box->smallend).vect[1];
      iVar10 = (box->smallend).vect[0];
      lVar43 = (long)iVar10;
      dVar1 = *dxinv;
      lVar58 = (long)iVar21 * 8;
      local_198 = (long)pdVar59 +
                  (lVar58 + (lVar71 - iVar22) * lVar48 * 8 + (long)iVar72 * -8) * lVar74 +
                  lVar43 * 8 + lVar70 * -8;
      local_118 = (lVar58 + (lVar71 - lVar68) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar43 * 8 +
                  lVar64 * -8 + (long)pdVar18;
      local_1f0 = (long)pdVar15 +
                  (lVar58 + (lVar71 - iVar67) * lVar36 * 8 + (long)iVar53 * -8) * lVar35 +
                  lVar43 * 8 + lVar46 * -8;
      local_1b0 = (double *)0x0;
      do {
        if (iVar75 <= iVar20) {
          local_200 = local_1f0;
          local_208 = local_118;
          local_210 = local_198;
          local_1e8 = lVar71;
          do {
            if (iVar21 <= iVar2) {
              lVar46 = local_208;
              lVar70 = (long)iVar21;
              lVar58 = local_200;
              lVar43 = local_210;
              do {
                if (iVar10 <= iVar47) {
                  lVar52 = 0;
                  do {
                    *(double *)(lVar58 + lVar52 * 8) =
                         (*(double *)(lVar46 + lVar52 * 8) -
                         pdVar18[(lVar70 - lVar66) * lVar28 +
                                 (local_1e8 - lVar68) * lVar42 +
                                 lVar29 * (long)local_1b0 +
                                 (long)(int)(~uVar6 + iVar10 + (int)lVar52)]) *
                         *(double *)(lVar43 + lVar52 * 8) * -dVar1 * bscalar;
                    lVar52 = lVar52 + 1;
                  } while ((iVar47 - iVar10) + 1 != (int)lVar52);
                }
                lVar70 = lVar70 + 1;
                lVar43 = lVar43 + lVar74 * 8;
                lVar46 = lVar46 + lVar28 * 8;
                lVar58 = lVar58 + lVar35 * 8;
              } while (iVar2 + 1 != (int)lVar70);
            }
            local_1e8 = local_1e8 + 1;
            local_210 = local_210 + lVar48 * lVar74 * 8;
            local_208 = local_208 + lVar42 * 8;
            local_200 = local_200 + lVar36 * lVar35 * 8;
          } while (iVar20 + 1 != (int)local_1e8);
        }
        local_1b0 = (double *)((long)local_1b0 + 1);
        local_198 = local_198 + lVar30 * lVar48 * lVar74 * 8;
        local_118 = local_118 + lVar29 * 8;
        local_1f0 = local_1f0 + lVar25 * lVar36 * lVar35 * 8;
      } while (local_1b0 != (double *)(ulong)(uint)ncomp);
    }
    if (0 < ncomp) {
      iVar2 = (box->bigend).vect[0];
      iVar20 = (box->bigend).vect[1] + (uint)((uVar9 & 2) == 0);
      iVar72 = (box->bigend).vect[2];
      iVar22 = (box->smallend).vect[2];
      lVar30 = (long)iVar22;
      iVar53 = (box->smallend).vect[1];
      iVar67 = (box->smallend).vect[0];
      lVar36 = (long)iVar67;
      dVar1 = dxinv[1];
      lVar25 = (long)iVar53 * 8;
      local_110 = (long)pdVar13 +
                  (lVar25 + (lVar30 - iVar54) * lVar32 * 8 + lVar65 * -8) * lVar31 + lVar36 * 8 +
                  lVar60 * -8;
      lVar35 = (lVar30 - lVar68) * lVar41;
      local_1f0 = (lVar25 + lVar35 * 8 + lVar66 * -8) * lVar28 + lVar36 * 8 + lVar64 * -8 +
                  (long)pdVar18;
      local_1b0 = pdVar18 + (lVar36 - lVar64);
      local_108 = (long)pdVar16 +
                  (lVar25 + (lVar30 - iVar4) * lVar38 * 8 + lVar62 * -8) * lVar37 + lVar36 * 8 +
                  lVar50 * -8;
      uVar45 = 0;
      do {
        lVar25 = local_108;
        lVar36 = local_1f0;
        lVar46 = local_110;
        pdVar59 = local_1b0;
        lVar48 = lVar30;
        if (iVar22 <= iVar72) {
          do {
            lVar50 = lVar25;
            lVar60 = (long)iVar53;
            lVar62 = lVar36;
            lVar65 = lVar46;
            iVar54 = ~uVar7 + iVar53;
            if (iVar53 <= iVar20) {
              do {
                if (iVar67 <= iVar2) {
                  lVar70 = 0;
                  do {
                    *(double *)(lVar50 + lVar70 * 8) =
                         (*(double *)(lVar62 + lVar70 * 8) -
                         *(double *)
                          ((long)pdVar59 + lVar70 * 8 + (lVar35 * 8 + (long)iVar54 * 8) * lVar28)) *
                         *(double *)(lVar65 + lVar70 * 8) * -dVar1 * bscalar;
                    lVar70 = lVar70 + 1;
                  } while ((iVar2 - iVar67) + 1 != (int)lVar70);
                }
                lVar60 = lVar60 + 1;
                lVar65 = lVar65 + lVar31 * 8;
                lVar62 = lVar62 + lVar28 * 8;
                iVar54 = iVar54 + 1;
                lVar50 = lVar50 + lVar37 * 8;
              } while (iVar20 + 1 != (int)lVar60);
            }
            lVar48 = lVar48 + 1;
            lVar25 = lVar25 + lVar38 * lVar37 * 8;
            lVar36 = lVar36 + lVar42 * 8;
            lVar46 = lVar46 + lVar32 * lVar31 * 8;
            pdVar59 = pdVar59 + lVar42;
          } while (iVar72 + 1 != (int)lVar48);
        }
        uVar45 = uVar45 + 1;
        local_110 = local_110 + lVar23 * lVar32 * lVar31 * 8;
        local_1f0 = local_1f0 + lVar29 * 8;
        local_1b0 = local_1b0 + lVar29;
        local_108 = local_108 + lVar26 * lVar38 * lVar37 * 8;
      } while (uVar45 != (uint)ncomp);
    }
    if (0 < ncomp) {
      iVar67 = (box->bigend).vect[2] + (uint)((uVar9 & 4) == 0);
      iVar2 = (box->smallend).vect[2];
      lVar26 = (long)iVar2;
      dVar1 = dxinv[2];
      iVar72 = (box->smallend).vect[1];
      lVar23 = (long)iVar72 * 8;
      iVar22 = (box->smallend).vect[0];
      lVar25 = (long)iVar22;
      local_e8 = (long)pdVar14 +
                 (lVar23 + (lVar26 - iVar3) * lVar34 * 8 + lVar61 * -8) * lVar33 + lVar25 * 8 +
                 lVar49 * -8;
      iVar53 = (box->bigend).vect[0];
      iVar54 = (box->bigend).vect[1];
      local_1f8 = pdVar18 + (lVar25 - lVar64);
      local_210 = (lVar23 + (lVar26 - lVar68) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar25 * 8 +
                  lVar64 * -8 + (long)pdVar18;
      local_f0 = (long)pdVar17 +
                 (lVar23 + (lVar26 - iVar5) * lVar40 * 8 + lVar63 * -8) * lVar39 + lVar25 * 8 +
                 lVar51 * -8;
      uVar45 = 0;
      do {
        if (iVar2 <= iVar67) {
          local_218 = local_f0;
          local_220 = local_210;
          lVar25 = local_e8;
          lVar30 = lVar26;
          iVar3 = ~uVar8 + iVar2;
          do {
            if (iVar72 <= iVar54) {
              pdVar59 = (double *)
                        (((long)iVar3 * lVar41 * 8 + lVar23 + lVar66 * -8) * lVar28 +
                        (long)local_1f8);
              lVar31 = lVar25;
              lVar32 = local_218;
              lVar35 = local_220;
              lVar36 = (long)iVar72;
              do {
                if (iVar22 <= iVar53) {
                  lVar37 = 0;
                  do {
                    *(double *)(lVar32 + lVar37 * 8) =
                         (*(double *)(lVar35 + lVar37 * 8) - pdVar59[lVar37]) *
                         *(double *)(lVar31 + lVar37 * 8) * -dVar1 * bscalar;
                    lVar37 = lVar37 + 1;
                  } while ((iVar53 - iVar22) + 1 != (int)lVar37);
                }
                lVar36 = lVar36 + 1;
                lVar31 = lVar31 + lVar33 * 8;
                pdVar59 = pdVar59 + lVar28;
                lVar35 = lVar35 + lVar28 * 8;
                lVar32 = lVar32 + lVar39 * 8;
              } while (iVar54 + 1 != (int)lVar36);
            }
            lVar30 = lVar30 + 1;
            lVar25 = lVar25 + lVar34 * lVar33 * 8;
            iVar3 = iVar3 + 1;
            local_220 = local_220 + lVar42 * 8;
            local_218 = local_218 + lVar40 * lVar39 * 8;
          } while (iVar67 + 1 != (int)lVar30);
        }
        uVar45 = uVar45 + 1;
        local_e8 = local_e8 + lVar24 * lVar34 * lVar33 * 8;
        local_1f8 = local_1f8 + lVar29;
        local_210 = local_210 + lVar29 * 8;
        local_f0 = local_f0 + lVar27 * lVar40 * lVar39 * 8;
      } while (uVar45 != (uint)ncomp);
    }
  }
  else {
    uVar45 = (ulong)(uint)ncomp;
    if (0 < ncomp) {
      lVar71 = *(long *)(box->smallend).vect;
      iVar2 = (box->smallend).vect[2];
      lVar56 = (long)iVar2;
      iVar75 = (int)lVar71;
      iVar20 = ((box->bigend).vect[0] + iVar75) - (box->smallend).vect[0];
      lVar58 = (lVar71 >> 0x20) * 8;
      lVar52 = (lVar58 + (lVar56 - iVar22) * lVar48 * 8 + (long)iVar72 * -8) * lVar74;
      lVar43 = (long)(iVar20 + 1);
      local_118 = lVar52 + lVar43 * 8 + lVar70 * -8 + (long)pdVar59;
      lVar57 = (long)iVar75;
      local_d8 = lVar52 + lVar57 * 8 + lVar70 * -8 + (long)pdVar59;
      lVar52 = (lVar58 + (lVar56 - lVar68) * lVar41 * 8 + lVar66 * -8) * lVar28;
      iVar72 = (box->bigend).vect[1];
      lVar70 = (lVar58 + (lVar56 - iVar67) * lVar36 * 8 + (long)iVar53 * -8) * lVar35;
      iVar22 = (box->bigend).vect[2];
      dVar1 = *dxinv;
      lVar30 = lVar30 * lVar48 * lVar74 * 8;
      lVar48 = lVar48 * lVar74 * 8;
      local_e0 = lVar70 + lVar43 * 8 + lVar46 * -8 + (long)pdVar15;
      local_140 = lVar70 + lVar57 * 8 + lVar46 * -8 + (long)pdVar15;
      local_218._0_4_ = (int)((ulong)lVar71 >> 0x20);
      iVar53 = (int)local_218;
      iVar67 = iVar72 - (int)local_218;
      lVar25 = lVar25 * lVar36 * lVar35 * 8;
      lVar36 = lVar36 * lVar35 * 8;
      local_1f0 = 0;
      uVar44 = 0;
      do {
        if (iVar2 <= iVar22) {
          local_218 = local_1f0;
          lVar46 = lVar56;
          lVar70 = local_140;
          lVar58 = local_e0;
          lVar71 = local_d8;
          lVar76 = local_118;
          do {
            if (iVar53 <= iVar72) {
              lVar55 = 0;
              lVar73 = 0;
              lVar69 = local_218;
              iVar21 = iVar67 + 1;
              do {
                *(double *)(lVar70 + lVar55) =
                     (*(double *)((long)pdVar18 + lVar69 + lVar52 + lVar57 * 8 + lVar64 * -8) -
                     *(double *)((long)pdVar18 + lVar69 + lVar52 + (long)(int)(~uVar6 + iVar75) * 8)
                     ) * *(double *)(lVar71 + lVar73) * -dVar1 * bscalar;
                *(double *)(lVar58 + lVar55) =
                     (*(double *)((long)pdVar18 + lVar69 + lVar52 + lVar43 * 8 + lVar64 * -8) -
                     *(double *)
                      ((long)pdVar18 + lVar69 + lVar52 + (long)(int)(iVar20 + ~uVar6 + 1) * 8)) *
                     *(double *)(lVar76 + lVar73) * -dVar1 * bscalar;
                lVar73 = lVar73 + lVar74 * 8;
                lVar69 = lVar69 + lVar28 * 8;
                lVar55 = lVar55 + lVar35 * 8;
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            lVar46 = lVar46 + 1;
            lVar76 = lVar76 + lVar48;
            lVar71 = lVar71 + lVar48;
            local_218 = local_218 + lVar42 * 8;
            lVar58 = lVar58 + lVar36;
            lVar70 = lVar70 + lVar36;
          } while (iVar22 + 1 != (int)lVar46);
        }
        uVar44 = uVar44 + 1;
        local_118 = local_118 + lVar30;
        local_d8 = local_d8 + lVar30;
        local_1f0 = local_1f0 + lVar29 * 8;
        local_e0 = local_e0 + lVar25;
        local_140 = local_140 + lVar25;
      } while (uVar44 != uVar45);
    }
    iVar2 = (box->bigend).vect[2];
    if (0 < ncomp) {
      iVar72 = (box->smallend).vect[2];
      lVar70 = (long)iVar72;
      lVar25 = *(long *)(box->smallend).vect;
      iVar53 = (int)((ulong)lVar25 >> 0x20);
      iVar67 = (iVar53 + (box->bigend).vect[1]) - (box->smallend).vect[1];
      lVar35 = (lVar70 - iVar54) * lVar32;
      lVar36 = (lVar25 >> 0x20) * 8;
      lVar46 = (long)(iVar67 + 1) * 8;
      iVar54 = (int)lVar25;
      lVar30 = (long)iVar54;
      lVar74 = (lVar36 + lVar35 * 8 + lVar65 * -8) * lVar31 + lVar30 * 8 + lVar60 * -8 +
               (long)pdVar13;
      lVar65 = (lVar46 + lVar35 * 8 + lVar65 * -8) * lVar31 + lVar30 * 8 + lVar60 * -8 +
               (long)pdVar13;
      lVar48 = (lVar70 - lVar68) * lVar41;
      dVar1 = dxinv[1];
      lVar60 = (lVar70 - iVar4) * lVar38;
      iVar22 = (box->bigend).vect[0];
      lVar35 = lVar23 * lVar32 * lVar31 * 8;
      lVar32 = lVar32 * lVar31 * 8;
      lVar68 = (lVar36 + lVar48 * 8 + lVar66 * -8) * lVar28 + lVar30 * 8 + lVar64 * -8 +
               (long)pdVar18;
      lVar23 = lVar29 * 8;
      lVar42 = lVar42 * 8;
      lVar25 = ((long)(int)(iVar53 + ~uVar7) * 8 + lVar48 * 8) * lVar28 + lVar30 * 8 + lVar64 * -8 +
               (long)pdVar18;
      lVar36 = (lVar36 + lVar60 * 8 + lVar62 * -8) * lVar37 + lVar30 * 8 + lVar50 * -8 +
               (long)pdVar16;
      lVar26 = lVar26 * lVar38 * lVar37 * 8;
      lVar38 = lVar38 * lVar37 * 8;
      iVar53 = (iVar22 - iVar54) + 1;
      lVar31 = (lVar46 + lVar48 * 8 + lVar66 * -8) * lVar28 + lVar30 * 8 + lVar64 * -8 +
               (long)pdVar18;
      lVar48 = ((long)(int)(~uVar7 + iVar67 + 1) * 8 + lVar48 * 8) * lVar28 + lVar30 * 8 +
               lVar64 * -8 + (long)pdVar18;
      lVar30 = (lVar46 + lVar60 * 8 + lVar62 * -8) * lVar37 + lVar30 * 8 + lVar50 * -8 +
               (long)pdVar16;
      local_1f8 = (double *)0x0;
      do {
        lVar37 = lVar30;
        lVar46 = lVar70;
        lVar50 = lVar36;
        lVar60 = lVar25;
        lVar62 = lVar65;
        lVar58 = lVar31;
        lVar71 = lVar68;
        lVar43 = lVar48;
        lVar52 = lVar74;
        if (iVar72 <= iVar2) {
          do {
            if (iVar54 <= iVar22) {
              lVar56 = 0;
              do {
                *(double *)(lVar50 + lVar56 * 8) =
                     (*(double *)(lVar71 + lVar56 * 8) - *(double *)(lVar60 + lVar56 * 8)) *
                     *(double *)(lVar52 + lVar56 * 8) * -(dVar1 * bscalar);
                lVar56 = lVar56 + 1;
              } while (iVar53 != (int)lVar56);
            }
            if (iVar54 <= iVar22) {
              lVar56 = 0;
              do {
                *(double *)(lVar37 + lVar56 * 8) =
                     (*(double *)(lVar58 + lVar56 * 8) - *(double *)(lVar43 + lVar56 * 8)) *
                     *(double *)(lVar62 + lVar56 * 8) * -(dVar1 * bscalar);
                lVar56 = lVar56 + 1;
              } while (iVar53 != (int)lVar56);
            }
            lVar46 = lVar46 + 1;
            lVar52 = lVar52 + lVar32;
            lVar71 = lVar71 + lVar42;
            lVar60 = lVar60 + lVar42;
            lVar50 = lVar50 + lVar38;
            lVar62 = lVar62 + lVar32;
            lVar58 = lVar58 + lVar42;
            lVar43 = lVar43 + lVar42;
            lVar37 = lVar37 + lVar38;
          } while (iVar2 + 1 != (int)lVar46);
        }
        local_1f8 = (double *)((long)local_1f8 + 1);
        lVar74 = lVar74 + lVar35;
        lVar68 = lVar68 + lVar23;
        lVar25 = lVar25 + lVar23;
        lVar36 = lVar36 + lVar26;
        lVar65 = lVar65 + lVar35;
        lVar31 = lVar31 + lVar23;
        lVar48 = lVar48 + lVar23;
        lVar30 = lVar30 + lVar26;
      } while (local_1f8 != (double *)uVar45);
    }
    if (0 < ncomp) {
      dVar1 = dxinv[2];
      iVar72 = (box->smallend).vect[2];
      iVar53 = iVar2 + 1;
      lVar25 = *(long *)(box->smallend).vect;
      lVar31 = lVar25 >> 0x20;
      lVar23 = lVar31 * 8;
      iVar54 = (int)lVar25;
      lVar26 = (long)iVar54;
      lVar30 = (lVar23 + (iVar72 - iVar3) * lVar34 * 8 + lVar61 * -8) * lVar33 + lVar26 * 8 +
               lVar49 * -8 + (long)pdVar14;
      local_220 = (lVar23 + (iVar53 - iVar3) * lVar34 * 8 + lVar61 * -8) * lVar33 + lVar26 * 8 +
                  lVar49 * -8 + (long)pdVar14;
      lVar36 = (lVar23 + (int)(~uVar8 + iVar72) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar26 * 8 +
               lVar64 * -8 + (long)pdVar18;
      lVar35 = (lVar23 + (int)(iVar72 - uVar8) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar26 * 8 +
               lVar64 * -8 + (long)pdVar18;
      local_1b8 = (lVar23 + (int)(iVar2 - uVar8) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar26 * 8 +
                  lVar64 * -8 + (long)pdVar18;
      local_1d0 = (lVar23 + (int)(iVar53 - uVar8) * lVar41 * 8 + lVar66 * -8) * lVar28 + lVar26 * 8
                  + lVar64 * -8 + (long)pdVar18;
      uVar19 = *(undefined8 *)(box->bigend).vect;
      iVar22 = (int)uVar19;
      lVar32 = (lVar23 + (iVar72 - iVar5) * lVar40 * 8 + lVar63 * -8) * lVar39 + lVar26 * 8 +
               lVar51 * -8 + (long)pdVar17;
      lVar23 = (lVar23 + (iVar53 - iVar5) * lVar40 * 8 + lVar63 * -8) * lVar39 + lVar26 * 8 +
               lVar51 * -8 + (long)pdVar17;
      lVar26 = lVar34 * lVar33 * lVar24 * 8;
      lVar29 = lVar29 * 8;
      lVar28 = lVar28 * 8;
      lVar24 = lVar40 * lVar39 * lVar27 * 8;
      iVar72 = (iVar22 - iVar54) + 1;
      iVar2 = (int)((ulong)uVar19 >> 0x20);
      uVar44 = 0;
      do {
        iVar53 = (int)((ulong)lVar25 >> 0x20);
        lVar27 = lVar31;
        lVar34 = lVar30;
        lVar37 = lVar32;
        lVar38 = lVar35;
        lVar40 = lVar36;
        if (iVar53 <= iVar2) {
          do {
            if (iVar54 <= iVar22) {
              lVar41 = 0;
              do {
                *(double *)(lVar37 + lVar41 * 8) =
                     (*(double *)(lVar38 + lVar41 * 8) - *(double *)(lVar40 + lVar41 * 8)) *
                     *(double *)(lVar34 + lVar41 * 8) * -(bscalar * dVar1);
                lVar41 = lVar41 + 1;
              } while (iVar72 != (int)lVar41);
            }
            lVar27 = lVar27 + 1;
            lVar34 = lVar34 + lVar33 * 8;
            lVar40 = lVar40 + lVar28;
            lVar38 = lVar38 + lVar28;
            lVar37 = lVar37 + lVar39 * 8;
          } while (iVar2 + 1 != (int)lVar27);
        }
        lVar27 = lVar31;
        lVar34 = local_220;
        lVar37 = lVar23;
        lVar38 = local_1d0;
        lVar40 = local_1b8;
        if (iVar53 <= iVar2) {
          do {
            if (iVar54 <= iVar22) {
              lVar41 = 0;
              do {
                *(double *)(lVar37 + lVar41 * 8) =
                     (*(double *)(lVar38 + lVar41 * 8) - *(double *)(lVar40 + lVar41 * 8)) *
                     *(double *)(lVar34 + lVar41 * 8) * -(bscalar * dVar1);
                lVar41 = lVar41 + 1;
              } while (iVar72 != (int)lVar41);
            }
            lVar27 = lVar27 + 1;
            lVar34 = lVar34 + lVar33 * 8;
            lVar40 = lVar40 + lVar28;
            lVar38 = lVar38 + lVar28;
            lVar37 = lVar37 + lVar39 * 8;
          } while (iVar2 + 1 != (int)lVar27);
        }
        uVar44 = uVar44 + 1;
        lVar30 = lVar30 + lVar26;
        lVar36 = lVar36 + lVar29;
        lVar35 = lVar35 + lVar29;
        lVar32 = lVar32 + lVar24;
        local_220 = local_220 + lVar26;
        local_1b8 = local_1b8 + lVar29;
        local_1d0 = local_1d0 + lVar29;
        lVar23 = lVar23 + lVar24;
      } while (uVar44 != uVar45);
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (Box const& box, Real const* dxinv, Real bscalar,
                        Array<FArrayBox const*, AMREX_SPACEDIM> const& bcoef,
                        Array<FArrayBox*,AMREX_SPACEDIM> const& flux,
                        FArrayBox const& sol, int face_only, int ncomp)
{
    AMREX_D_TERM(const auto bx = bcoef[0]->const_array();,
                 const auto by = bcoef[1]->const_array();,
                 const auto bz = bcoef[2]->const_array(););
    AMREX_D_TERM(const auto& fxarr = flux[0]->array();,
                 const auto& fyarr = flux[1]->array();,
                 const auto& fzarr = flux[2]->array(););
    const auto& solarr = sol.array();

    if (face_only)
    {
        Real fac = bscalar*dxinv[0];
        Box blo = amrex::bdryLo(box, 0);
        int blen = box.length(0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_xface(tbox, fxarr, solarr, bx, fac, blen, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        blo = amrex::bdryLo(box, 1);
        blen = box.length(1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_yface(tbox, fyarr, solarr, by, fac, blen, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        blo = amrex::bdryLo(box, 2);
        blen = box.length(2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_zface(tbox, fzarr, solarr, bz, fac, blen, ncomp);
        });
#endif
    }
    else
    {
        Real fac = bscalar*dxinv[0];
        Box bflux = amrex::surroundingNodes(box, 0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_x(tbox, fxarr, solarr, bx, fac, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        bflux = amrex::surroundingNodes(box, 1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_y(tbox, fyarr, solarr, by, fac, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        bflux = amrex::surroundingNodes(box, 2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_z(tbox, fzarr, solarr, bz, fac, ncomp);
        });
#endif
    }
}